

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void output_ctable(void)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  
  if (rflag == '\0') {
    fwrite("static ",7,1,(FILE *)output_file);
  }
  if (conflicts == (Yshort *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (ulong)(uint)*conflicts;
  }
  fprintf((FILE *)output_file,"int %sctable[] = {%39d,",symbol_prefix,uVar1);
  if (1 < nconflicts) {
    iVar2 = 10;
    lVar3 = 1;
    do {
      if (iVar2 < 10) {
        iVar2 = iVar2 + 1;
      }
      else {
        if (rflag == '\0') {
          outline = outline + 1;
        }
        putc(10,(FILE *)output_file);
        iVar2 = 1;
      }
      fprintf((FILE *)output_file,"%5d,",(ulong)(uint)conflicts[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < nconflicts);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fwrite("\n};\n",4,1,(FILE *)output_file);
  if (conflicts != (Yshort *)0x0) {
    free(conflicts);
    return;
  }
  return;
}

Assistant:

void output_ctable()
{
    register int i;
    register int j;

    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %sctable[] = {%39d,", symbol_prefix, conflicts ?
	    conflicts[0] : 0);

    j = 10;
    for (i = 1; i < nconflicts; i++)
    {
	if (j >= 10)
	{
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1;
	}
	else
	    ++j;

	fprintf(output_file, "%5d,", conflicts[i]);
    }
    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
    if (conflicts)
	FREE(conflicts);
}